

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O2

BaseFab<double> * __thiscall
amrex::BaseFab<double>::plus<(amrex::RunOn)0>
          (BaseFab<double> *this,BaseFab<double> *src,Box bx,SrcComp scomp,DestComp dcomp,
          NumComps ncomp)

{
  Box *pBVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  anon_class_144_4_062952f7 local_c0;
  
  Box::operator&=(&bx,&src->domain);
  local_c0.d.p = this->dptr;
  pBVar1 = &this->domain;
  local_c0.d.begin.x = (pBVar1->smallend).vect[0];
  local_c0.d.begin.y = (pBVar1->smallend).vect[1];
  lVar3 = (long)(this->domain).bigend.vect[1] + 1;
  iVar2 = (this->domain).bigend.vect[0];
  local_c0.d.jstride = ((long)iVar2 - (long)(pBVar1->smallend).vect[0]) + 1;
  local_c0.d.end._0_8_ = (ulong)(iVar2 + 1) | lVar3 << 0x20;
  local_c0.s.p = src->dptr;
  local_c0.s.ncomp = src->nvar;
  pBVar1 = &src->domain;
  local_c0.s.begin.x = (pBVar1->smallend).vect[0];
  local_c0.s.begin.y = (pBVar1->smallend).vect[1];
  lVar4 = (long)(src->domain).bigend.vect[1] + 1;
  iVar2 = (src->domain).bigend.vect[0];
  local_c0.s.jstride = ((long)iVar2 - (long)(pBVar1->smallend).vect[0]) + 1;
  local_c0.s.end._0_8_ = (ulong)(iVar2 + 1) | lVar4 << 0x20;
  local_c0.s.begin.z = (src->domain).smallend.vect[2];
  local_c0.d.ncomp = this->nvar;
  local_c0.d.begin.z = (this->domain).smallend.vect[2];
  local_c0.d.kstride = (lVar3 - (this->domain).smallend.vect[1]) * local_c0.d.jstride;
  lVar3 = (long)(this->domain).bigend.vect[2] + 1;
  local_c0.d.nstride = (lVar3 - local_c0.d.begin.z) * local_c0.d.kstride;
  local_c0.d.end.z = (int)lVar3;
  lVar3 = (long)(src->domain).bigend.vect[2] + 1;
  local_c0.s.kstride = (lVar4 - (src->domain).smallend.vect[1]) * local_c0.s.jstride;
  local_c0.s.nstride = (lVar3 - local_c0.s.begin.z) * local_c0.s.kstride;
  local_c0.s.end.z = (int)lVar3;
  local_c0.dcomp.i = dcomp.i;
  local_c0.scomp.i = scomp.i;
  LoopConcurrentOnCpu<amrex::BaseFab<double>::plus<(amrex::RunOn)0>(amrex::BaseFab<double>const&,amrex::Box,amrex::SrcComp,amrex::DestComp,amrex::NumComps)::_lambda(int,int,int,int)_1_>
            (&bx,ncomp.n,&local_c0);
  return this;
}

Assistant:

BaseFab<T>&
BaseFab<T>::plus (const BaseFab<T>& src, Box bx,
                  SrcComp scomp, DestComp dcomp, NumComps ncomp) noexcept
{
    AMREX_ASSERT(this->domain.sameType(src.domain));
    AMREX_ASSERT(scomp.i >= 0 && scomp.i+ncomp.n <= src.nvar);
    AMREX_ASSERT(dcomp.i >= 0 && dcomp.i+ncomp.n <= this->nvar);

    bx &= src.domain;

    Array4<T> const& d = this->array();
    Array4<T const> const& s = src.const_array();
    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(run_on, bx, ncomp.n, i, j, k, n,
    {
        d(i,j,k,n+dcomp.i) += s(i,j,k,n+scomp.i);
    });

    return *this;
}